

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
createMacro(Parser *parser,string *text,int flags,
           initializer_list<AssemblyTemplateArgument> variables)

{
  undefined4 in_register_00000014;
  initializer_list<AssemblyTemplateArgument> variables_00;
  pointer local_30;
  __uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_28;
  undefined4 local_1c;
  
  variables_00._M_array._4_4_ = in_register_00000014;
  variables_00._M_array._0_4_ = flags;
  local_1c = variables._M_array._0_4_;
  variables_00._M_len = variables._M_len;
  Parser::parseTemplate((Parser *)&stack0xffffffffffffffd0,text,variables_00);
  std::
  make_unique<MipsMacroCommand,std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,int&>
            ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
             &stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffd0);
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_28._M_t.
                super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
                .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  if (local_30 != (pointer)0x0) {
    (*(code *)(local_30->tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl.
              _M_node.super__List_node_base._M_prev)();
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> createMacro(Parser& parser, const std::string& text, int flags, std::initializer_list<AssemblyTemplateArgument> variables)
{
	std::unique_ptr<CAssemblerCommand> content = parser.parseTemplate(text,variables);
	return std::make_unique<MipsMacroCommand>(std::move(content),flags);
}